

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToDisk
          (GeneratorContextImpl *this,string *prefix)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer filename_00;
  char *pcVar4;
  int *piVar5;
  ostream *poVar6;
  ssize_t sVar7;
  int error_2;
  int error_1;
  int write_result;
  int error;
  undefined1 local_78 [4];
  int file_descriptor;
  string filename;
  void *pvStack_50;
  int size;
  char *data;
  string *relative_filename;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  local_28;
  const_iterator iter;
  string *prefix_local;
  GeneratorContextImpl *this_local;
  
  if ((this->had_error_ & 1U) == 0) {
    iter._M_node = (_Base_ptr)prefix;
    bVar1 = anon_unknown_0::VerifyDirectoryExists(prefix);
    if (bVar1) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
           ::begin(&this->files_);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ::_Rb_tree_const_iterator(&local_28,&local_30);
      while( true ) {
        relative_filename =
             (string *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
             ::end(&this->files_);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
        ::_Rb_tree_const_iterator(&local_38,(iterator *)&relative_filename);
        bVar1 = std::operator!=(&local_28,&local_38);
        if (!bVar1) break;
        filename_00 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                      ::operator->(&local_28);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
        ::operator->(&local_28);
        pvStack_50 = (void *)std::__cxx11::string::data();
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
        ::operator->(&local_28);
        filename.field_2._12_4_ = std::__cxx11::string::size();
        bVar1 = anon_unknown_0::TryCreateParentDirectory((string *)iter._M_node,&filename_00->first)
        ;
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_003566e7;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        iter._M_node,&filename_00->first);
        do {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          iVar2 = open(pcVar4,0x241,0x1b6);
          bVar1 = false;
          if (iVar2 < 0) {
            piVar5 = __errno_location();
            bVar1 = *piVar5 == 4;
          }
        } while (bVar1);
        if (iVar2 < 0) {
          piVar5 = __errno_location();
          iVar2 = *piVar5;
          poVar6 = std::operator<<((ostream *)&std::cerr,(string *)local_78);
          poVar6 = std::operator<<(poVar6,": ");
          pcVar4 = strerror(iVar2);
          std::operator<<(poVar6,pcVar4);
          this_local._7_1_ = 0;
          bVar1 = true;
        }
        else {
          for (; 0 < (int)filename.field_2._12_4_;
              filename.field_2._12_4_ = filename.field_2._12_4_ - iVar3) {
            do {
              sVar7 = write(iVar2,pvStack_50,(long)(int)filename.field_2._12_4_);
              iVar3 = (int)sVar7;
              bVar1 = false;
              if (iVar3 < 0) {
                piVar5 = __errno_location();
                bVar1 = *piVar5 == 4;
              }
            } while (bVar1);
            if (iVar3 < 1) {
              if (iVar3 < 0) {
                piVar5 = __errno_location();
                iVar2 = *piVar5;
                poVar6 = std::operator<<((ostream *)&std::cerr,(string *)local_78);
                poVar6 = std::operator<<(poVar6,": write: ");
                pcVar4 = strerror(iVar2);
                std::operator<<(poVar6,pcVar4);
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cerr,(string *)local_78);
                poVar6 = std::operator<<(poVar6,": write() returned zero?");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              }
              this_local._7_1_ = 0;
              bVar1 = true;
              goto LAB_003566bc;
            }
            pvStack_50 = (void *)((long)pvStack_50 + (long)iVar3);
          }
          iVar2 = close(iVar2);
          if (iVar2 == 0) {
            bVar1 = false;
          }
          else {
            piVar5 = __errno_location();
            iVar2 = *piVar5;
            poVar6 = std::operator<<((ostream *)&std::cerr,(string *)local_78);
            poVar6 = std::operator<<(poVar6,": close: ");
            pcVar4 = strerror(iVar2);
            std::operator<<(poVar6,pcVar4);
            this_local._7_1_ = 0;
            bVar1 = true;
          }
        }
LAB_003566bc:
        std::__cxx11::string::~string((string *)local_78);
        if (bVar1) goto LAB_003566e7;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
        ::operator++(&local_28);
      }
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_003566e7:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToDisk(
    const string& prefix) {
  if (had_error_) {
    return false;
  }

  if (!VerifyDirectoryExists(prefix)) {
    return false;
  }

  for (std::map<string, string*>::const_iterator iter = files_.begin();
       iter != files_.end(); ++iter) {
    const string& relative_filename = iter->first;
    const char* data = iter->second->data();
    int size = iter->second->size();

    if (!TryCreateParentDirectory(prefix, relative_filename)) {
      return false;
    }
    string filename = prefix + relative_filename;

    // Create the output file.
    int file_descriptor;
    do {
      file_descriptor =
        open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
    } while (file_descriptor < 0 && errno == EINTR);

    if (file_descriptor < 0) {
      int error = errno;
      std::cerr << filename << ": " << strerror(error);
      return false;
    }

    // Write the file.
    while (size > 0) {
      int write_result;
      do {
        write_result = write(file_descriptor, data, size);
      } while (write_result < 0 && errno == EINTR);

      if (write_result <= 0) {
        // Write error.

        // FIXME(kenton):  According to the man page, if write() returns zero,
        //   there was no error; write() simply did not write anything.  It's
        //   unclear under what circumstances this might happen, but presumably
        //   errno won't be set in this case.  I am confused as to how such an
        //   event should be handled.  For now I'm treating it as an error,
        //   since retrying seems like it could lead to an infinite loop.  I
        //   suspect this never actually happens anyway.

        if (write_result < 0) {
          int error = errno;
          std::cerr << filename << ": write: " << strerror(error);
        } else {
          std::cerr << filename << ": write() returned zero?" << std::endl;
        }
        return false;
      }

      data += write_result;
      size -= write_result;
    }

    if (close(file_descriptor) != 0) {
      int error = errno;
      std::cerr << filename << ": close: " << strerror(error);
      return false;
    }
  }

  return true;
}